

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O0

Test * __thiscall
testing::internal::TestFactoryImpl<Laplace2DProblem_heat_Test>::CreateTest
          (TestFactoryImpl<Laplace2DProblem_heat_Test> *this)

{
  Test *this_00;
  TestFactoryImpl<Laplace2DProblem_heat_Test> *this_local;
  
  this_00 = (Test *)operator_new(0x110);
  Laplace2DProblem_heat_Test::Laplace2DProblem_heat_Test((Laplace2DProblem_heat_Test *)this_00);
  return this_00;
}

Assistant:

Test* CreateTest() override { return new TestClass; }